

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSpatialAnchorsCreateInfoBaseHeaderML *value)

{
  XrStructureType type;
  pointer pbVar1;
  int iVar2;
  XrResult XVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *enabled_extension;
  pointer pbVar4;
  string error_str;
  string local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  type = value->type;
  if (type == XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_UUIDS_ML) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
LAB_001bbde2:
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrSpatialAnchorsCreateInfoFromUuidsML *)value);
      return XVar3;
    }
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (instance_info->enabled_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      iVar2 = std::__cxx11::string::compare((char *)pbVar4);
      if (iVar2 == 0) goto LAB_001bbde2;
    }
    error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_str,
               "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ","");
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_60,objects_info);
    CoreValidLogMessage(instance_info,&local_80,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_60,&error_str);
  }
  else {
    if (type != XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_POSE_ML) {
      InvalidStructureType
                (instance_info,command_name,objects_info,"XrSpatialAnchorsCreateInfoBaseHeaderML",
                 type,"VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",XR_TYPE_UNKNOWN,"");
      return XR_ERROR_VALIDATION_FAILURE;
    }
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
LAB_001bbdb5:
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrSpatialAnchorsCreateInfoFromPoseML *)value);
      return XVar3;
    }
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (instance_info->enabled_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      iVar2 = std::__cxx11::string::compare((char *)pbVar4);
      if (iVar2 == 0) goto LAB_001bbdb5;
    }
    error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_str,
               "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ","");
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_48,objects_info);
    CoreValidLogMessage(instance_info,&local_80,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_48,&error_str);
    local_60.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_60.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  if (local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_str._M_dataplus._M_p != &error_str.field_2) {
    operator_delete(error_str._M_dataplus._M_p,error_str.field_2._M_allocated_capacity + 1);
  }
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSpatialAnchorsCreateInfoBaseHeaderML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-next-next" because it is a base structure
    if (value->type == XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_POSE_ML) {
        const XrSpatialAnchorsCreateInfoFromPoseML* new_value = reinterpret_cast<const XrSpatialAnchorsCreateInfoFromPoseML*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_spatial_anchors")) {
            std::string error_str = "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ";
            error_str += "\"XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_POSE_ML\"";
            error_str += " which requires extension \"XR_ML_spatial_anchors\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_UUIDS_ML) {
        const XrSpatialAnchorsCreateInfoFromUuidsML* new_value = reinterpret_cast<const XrSpatialAnchorsCreateInfoFromUuidsML*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_spatial_anchors_storage")) {
            std::string error_str = "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ";
            error_str += "\"XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_UUIDS_ML\"";
            error_str += " which requires extension \"XR_ML_spatial_anchors_storage\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrSpatialAnchorsCreateInfoBaseHeaderML",
                         value->type, "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}